

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void DecoalesceMergedSets(ExpressionContext *ctx,VmFunction *function)

{
  VmInstruction *variable;
  VmInstruction *pVVar1;
  VmBlock *pVVar2;
  VmInstruction *currIdom;
  uint color;
  ulong uVar3;
  VmInstruction *pVVar4;
  ulong uVar5;
  SmallArray<VmInstruction_*,_32U> mergedSet;
  SmallArray<VmInstruction_*,_32U> local_148;
  
  pVVar2 = function->firstBlock;
  if (pVVar2 != (VmBlock *)0x0) {
    do {
      pVVar4 = pVVar2->firstInstruction;
      while (pVVar1 = pVVar4, pVVar1 != (VmInstruction *)0x0) {
        pVVar4 = pVVar1->nextSibling;
        if ((pVVar1->cmd == VM_INST_PHI) && (pVVar1->marker == 0)) {
          local_148.allocator = ctx->allocator;
          local_148.data = local_148.little;
          local_148.count = 0;
          local_148.max = 0x20;
          CollectMergedSet(pVVar1,pVVar1->color,&local_148);
          qsort(local_148.data,local_148._8_8_ & 0xffffffff,8,SortByDominancePreOrder);
          uVar3 = local_148._8_8_ & 0xffffffff;
          if (local_148.count != 0) {
            uVar5 = 0;
            currIdom = (VmInstruction *)0x0;
            do {
              variable = local_148.data[uVar5];
              DeCoalesce(variable,function,currIdom);
              uVar5 = uVar5 + 1;
              uVar3 = local_148._8_8_ & 0xffffffff;
              currIdom = variable;
            } while (uVar5 < uVar3);
          }
          if ((int)uVar3 != 0) {
            uVar5 = 0;
            do {
              if (local_148.data[uVar5]->color == 0) {
                local_148.data[uVar5]->marker = 0;
              }
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
          if (pVVar1->color == 0) {
            pVVar4 = pVVar1;
          }
          if (local_148.count != 0) {
            uVar3 = 0;
            do {
              pVVar1 = local_148.data[uVar3];
              if ((pVVar1->cmd == VM_INST_PHI) && (pVVar1->color == 0)) {
                color = function->nextColor + 1;
                function->nextColor = color;
                ColorPhiWeb(pVVar1,color);
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 < (local_148._8_8_ & 0xffffffff));
          }
          SmallArray<VmInstruction_*,_32U>::~SmallArray(&local_148);
        }
      }
      pVVar2 = pVVar2->nextSibling;
    } while (pVVar2 != (VmBlock *)0x0);
  }
  return;
}

Assistant:

void DecoalesceMergedSets(ExpressionContext &ctx, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst;)
		{
			VmInstruction *next = inst->nextSibling;

			if(inst->cmd == VM_INST_PHI && inst->marker == 0)
			{
				SmallArray<VmInstruction*, 32> mergedSet(ctx.allocator);

				CollectMergedSet(inst, inst->color, mergedSet);

				// Now sort merged set in depth-first-search pre-order of the dominance tree
				qsort(mergedSet.data, mergedSet.count, sizeof(mergedSet[0]), SortByDominancePreOrder);

				VmInstruction *currImmediateDominator = NULL;

				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					DeCoalesce(variable, function, currImmediateDominator);

					currImmediateDominator = variable;
				}

				// Clear markers of uncolored variables
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->color == 0)
						variable->marker = 0;
				}

				// If current phi was uncolored, retry iteration
				if(inst->color == 0)
					next = inst;

				// Assign new colors to uncolored phi webs
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->cmd == VM_INST_PHI && variable->color == 0)
						ColorPhiWeb(variable, ++function->nextColor);
				}
			}

			inst = next;
		}
	}
}